

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::gaussian_filter(float t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 local_10;
  undefined4 local_c;
  float t_local;
  
  local_10 = t;
  if (t < 0.0) {
    local_10 = -t;
  }
  if (1.25 <= local_10) {
    local_c = 0.0;
  }
  else {
    dVar1 = std::exp((double)(ulong)(uint)(local_10 * -2.0 * local_10));
    dVar2 = sqrt(0.6366197723675814);
    dVar3 = blackman_exact_window((double)(local_10 / 1.25));
    local_c = clean((double)SUB84(dVar1,0) * dVar2 * dVar3);
  }
  return local_c;
}

Assistant:

static float gaussian_filter(float t) // with blackman window
    {
        if (t < 0)
        {
            t = -t;
        }
        if (t < GAUSSIAN_SUPPORT)
        {
            return clean(exp(-2.0f * t * t) * sqrt(2.0f / M_PI) * blackman_exact_window(t / GAUSSIAN_SUPPORT));
        }
        else
        {
            return 0.0f;
        }
    }